

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPPacketBuilder::BuildPacketEx
          (RTPPacketBuilder *this,void *data,size_t len,uint16_t hdrextID,void *hdrextdata,
          size_t numhdrextwords)

{
  int iVar1;
  
  iVar1 = -0x14;
  if ((((this->init == true) && (iVar1 = -0x11, this->defptset == true)) &&
      (iVar1 = -0x10, this->defmarkset == true)) && (iVar1 = -0x12, this->deftsset == true)) {
    iVar1 = PrivateBuildPacket(this,data,len,this->defaultpayloadtype,this->defaultmark,
                               this->defaulttimestampinc,true,hdrextID,hdrextdata,numhdrextwords);
  }
  return iVar1;
}

Assistant:

int RTPPacketBuilder::BuildPacketEx(const void *data,size_t len,
                  uint16_t hdrextID,const void *hdrextdata,size_t numhdrextwords)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (!defptset)
		return ERR_RTP_PACKBUILD_DEFAULTPAYLOADTYPENOTSET;
	if (!defmarkset)
		return ERR_RTP_PACKBUILD_DEFAULTMARKNOTSET;
	if (!deftsset)
		return ERR_RTP_PACKBUILD_DEFAULTTSINCNOTSET;
	return PrivateBuildPacket(data,len,defaultpayloadtype,defaultmark,defaulttimestampinc,true,hdrextID,hdrextdata,numhdrextwords);
}